

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O1

int Mvc_CoverCheckSuppContainment(Mvc_Cover_t *pCover1,Mvc_Cover_t *pCover2)

{
  Mvc_Cube_t *pMVar1;
  bool bVar2;
  uint uVar3;
  
  if (pCover1->nBits != pCover2->nBits) {
    __assert_fail("pCover1->nBits == pCover2->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcUtils.c"
                  ,0xfa,"int Mvc_CoverCheckSuppContainment(Mvc_Cover_t *, Mvc_Cover_t *)");
  }
  Mvc_CoverAllocateMask(pCover1);
  Mvc_CoverSupport(pCover1,pCover1->pMask);
  Mvc_CoverAllocateMask(pCover2);
  Mvc_CoverSupport(pCover2,pCover2->pMask);
  pMVar1 = pCover2->pMask;
  uVar3 = *(uint *)&pMVar1->field_0x8 & 0xffffff;
  if (uVar3 == 0) {
    uVar3 = ~pCover1->pMask->pData[0] & pMVar1->pData[0];
  }
  else if (uVar3 == 1) {
    uVar3 = 1;
    if ((pMVar1->pData[0] & ~pCover1->pMask->pData[0]) == 0) {
      uVar3 = (uint)((*(uint *)&pMVar1->field_0x14 & ~*(uint *)&pCover1->pMask->field_0x14) != 0);
    }
  }
  else {
    do {
      if ((pMVar1->pData[uVar3] & ~pCover1->pMask->pData[uVar3]) != 0) {
        uVar3 = 1;
        goto LAB_0040cae5;
      }
      bVar2 = 0 < (int)uVar3;
      uVar3 = uVar3 - 1;
    } while (bVar2);
    uVar3 = 0;
  }
LAB_0040cae5:
  return (int)(uVar3 == 0);
}

Assistant:

int Mvc_CoverCheckSuppContainment( Mvc_Cover_t * pCover1, Mvc_Cover_t * pCover2 )
{
    int Result;
    assert( pCover1->nBits == pCover2->nBits );
    // set the supports
    Mvc_CoverAllocateMask( pCover1 );
    Mvc_CoverSupport( pCover1, pCover1->pMask );
    Mvc_CoverAllocateMask( pCover2 );
    Mvc_CoverSupport( pCover2, pCover2->pMask );
    // check the containment
    Mvc_CubeBitNotImpl( Result, pCover2->pMask, pCover1->pMask );
    return !Result;
}